

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

Vec_Int_t * Saig_ManCbaFindReason(Saig_ManCba_t *p)

{
  undefined1 *puVar1;
  Abc_Cex_t *pAVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  Vec_Int_t *vPrios;
  int *piVar6;
  long lVar7;
  Vec_Int_t *vReasons;
  int iVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  Aig_Man_t *pAVar14;
  long lVar15;
  uint uVar16;
  byte bVar17;
  uint uVar18;
  
  pAVar14 = p->pFrames;
  iVar9 = pAVar14->vObjs->nSize;
  vPrios = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  vPrios->nSize = 0;
  vPrios->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  vPrios->pArray = piVar6;
  vPrios->nSize = iVar9;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)iVar9 << 2);
  }
  puVar1 = &pAVar14->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pVVar10 = p->pFrames->vCis;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    lVar13 = 0;
    do {
      lVar15 = (long)p->vMapPiF2A->nSize;
      if ((lVar15 <= lVar7) || (lVar15 <= lVar7 + 1)) goto LAB_00606bc7;
      piVar6 = p->vMapPiF2A->pArray;
      pAVar2 = p->pCex;
      iVar9 = pAVar2->nRegs + piVar6[lVar7] + pAVar2->nPis * piVar6[lVar7 + 1];
      lVar15 = *(long *)((long)pVVar10->pArray + lVar7 * 4);
      *(ulong *)(lVar15 + 0x18) =
           (*(ulong *)(lVar15 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((uint)(&pAVar2[1].iPo)[iVar9 >> 5] >> ((byte)iVar9 & 0x1f) & 1) * 8;
      iVar9 = *(int *)(lVar15 + 0x24);
      if (((long)iVar9 < 0) || (vPrios->nSize <= iVar9)) goto LAB_00606be6;
      vPrios->pArray[iVar9] = (int)lVar13;
      lVar13 = lVar13 + 1;
      pVVar10 = p->pFrames->vCis;
      lVar7 = lVar7 + 2;
    } while (lVar13 < pVVar10->nSize);
  }
  pAVar14 = p->pFrames;
  pVVar10 = pAVar14->vObjs;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar7];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7))
      {
        uVar4 = *(ulong *)((long)pvVar3 + 8);
        if (uVar4 == 0) {
          uVar18 = 0xffffffff;
        }
        else {
          uVar18 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar18 < 0) || (vPrios->nSize <= (int)uVar18)) {
LAB_00606bc7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = *(ulong *)((long)pvVar3 + 0x10);
        if (uVar5 == 0) {
          uVar12 = 0xffffffff;
        }
        else {
          uVar12 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar12 < 0) || (vPrios->nSize <= (int)uVar12)) goto LAB_00606bc7;
        uVar11 = (uint)uVar4 & 1;
        uVar16 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x18) >> 3 & 1;
        iVar9 = vPrios->pArray[uVar18];
        iVar8 = vPrios->pArray[uVar12];
        uVar18 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x18) >> 3 ^ (uint)uVar5;
        bVar17 = (byte)uVar18 & uVar11 != uVar16;
        *(ulong *)((long)pvVar3 + 0x18) =
             (*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar17 * 8;
        if (bVar17 == 1) {
          uVar12 = *(uint *)((long)pvVar3 + 0x24);
          if ((int)uVar12 < 0) {
LAB_00606be6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          if (iVar9 <= iVar8) {
            iVar9 = iVar8;
          }
        }
        else {
          uVar18 = uVar18 & 1;
          if ((uVar11 == uVar16) && (uVar18 != 0)) {
            uVar12 = *(uint *)((long)pvVar3 + 0x24);
            iVar8 = iVar9;
          }
          else {
            uVar12 = *(uint *)((long)pvVar3 + 0x24);
            if ((uVar11 == uVar16) || (uVar18 != 0)) {
              if (-1 < (int)uVar12) {
                if (iVar8 <= iVar9) {
                  iVar9 = iVar8;
                }
                goto LAB_00606ae5;
              }
              goto LAB_00606be6;
            }
          }
          iVar9 = iVar8;
          if ((int)uVar12 < 0) goto LAB_00606be6;
        }
LAB_00606ae5:
        if (vPrios->nSize <= (int)uVar12) goto LAB_00606be6;
        vPrios->pArray[uVar12] = iVar9;
      }
      lVar7 = lVar7 + 1;
      pAVar14 = p->pFrames;
      pVVar10 = pAVar14->vObjs;
    } while (lVar7 < pVVar10->nSize);
  }
  if (pAVar14->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = *pAVar14->vCos->pArray;
  uVar12 = (int)*(ulong *)((long)pvVar3 + 8) * 8 & 8;
  uVar18 = *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) & 8;
  *(ulong *)((long)pvVar3 + 0x18) =
       *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 | (ulong)(uVar12 ^ uVar18);
  if (uVar18 != uVar12) {
    __assert_fail("!pObj->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x15c,"Vec_Int_t *Saig_ManCbaFindReason(Saig_ManCba_t *)");
  }
  vReasons = (Vec_Int_t *)malloc(0x10);
  vReasons->nCap = 100;
  vReasons->nSize = 0;
  piVar6 = (int *)malloc(400);
  vReasons->pArray = piVar6;
  Aig_ManIncrementTravId(p->pFrames);
  Saig_ManCbaFindReason_rec
            (p->pFrames,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),vPrios,
             vReasons);
  if (vPrios->pArray != (int *)0x0) {
    free(vPrios->pArray);
    vPrios->pArray = (int *)0x0;
  }
  free(vPrios);
  return vReasons;
}

Assistant:

Vec_Int_t * Saig_ManCbaFindReason( Saig_ManCba_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vReasons;
    int i;

    // set PI values according to CEX
    vPrios = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    pObj->fPhase = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
    assert( !pObj->fPhase );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    Saig_ManCbaFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
//    assert( !Aig_ObjIsTravIdCurrent(p->pFrames, Aig_ManConst1(p->pFrames)) );
    return vReasons;
}